

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O1

void __thiscall
PoolResource<144UL,_8UL>::PoolResource(PoolResource<144UL,_8UL> *this,size_t chunk_size_bytes)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = chunk_size_bytes + (ulong)(chunk_size_bytes == 0) * 8 + 7;
  this->m_chunk_size_bytes = uVar2 & 0xfffffffffffffff8;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_allocated_chunks;
  (this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_allocated_chunks;
  memset(&(this->m_allocated_chunks).super__List_base<std::byte_*,_std::allocator<std::byte_*>_>.
          _M_impl._M_node._M_size,0,0xb0);
  if (uVar2 < 0x90) {
    __assert_fail("m_chunk_size_bytes >= MAX_BLOCK_SIZE_BYTES",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/support/allocators/pool.h"
                  ,0xb4,
                  "PoolResource<144, 8>::PoolResource(std::size_t) [MAX_BLOCK_SIZE_BYTES = 144, ALIGN_BYTES = 8]"
                 );
  }
  AllocateChunk(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PoolResource(std::size_t chunk_size_bytes)
        : m_chunk_size_bytes(NumElemAlignBytes(chunk_size_bytes) * ELEM_ALIGN_BYTES)
    {
        assert(m_chunk_size_bytes >= MAX_BLOCK_SIZE_BYTES);
        AllocateChunk();
    }